

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

SPxId __thiscall
soplex::SPxSteepPR<double>::selectEnterSparseCoDim(SPxSteepPR<double> *this,double *best,double tol)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int i;
  int iVar4;
  SPxSolverBase<double> *pSVar5;
  pointer pdVar6;
  pointer pdVar7;
  int *piVar8;
  DataKey DVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  double dVar13;
  
  pSVar5 = (this->super_SPxPricer<double>).thesolver;
  pdVar6 = (pSVar5->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (pSVar5->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar12 = (ulong)(uint)(pSVar5->infeasibilitiesCo).super_IdxSet.num;
  DVar9.info = 0;
  DVar9.idx = 0;
  uVar10 = 0xffffffff00000000;
LAB_002018ab:
  pSVar5 = (this->super_SPxPricer<double>).thesolver;
  dVar1 = *best;
  uVar11 = uVar12 & 0xffffffff;
  do {
    uVar12 = uVar12 - 1;
    if ((int)uVar11 < 1) {
      return (SPxId)(DataKey)(uVar10 | (ulong)DVar9 & 0xffffffff);
    }
    piVar8 = (pSVar5->infeasibilitiesCo).super_IdxSet.idx;
    i = piVar8[uVar12];
    dVar2 = pdVar6[i];
    if (-tol <= dVar2) {
      iVar4 = (pSVar5->infeasibilitiesCo).super_IdxSet.num;
      (pSVar5->infeasibilitiesCo).super_IdxSet.num = iVar4 + -1;
      piVar8[uVar12] = piVar8[(long)iVar4 + -1];
      (pSVar5->isInfeasibleCo).data[i] = 0;
    }
    else {
      dVar3 = pdVar7[i];
      dVar13 = tol;
      if (tol <= dVar3) {
        dVar13 = dVar3;
      }
      dVar13 = (dVar2 * dVar2) / dVar13;
      if (dVar1 < dVar13) break;
    }
    uVar11 = (ulong)((int)uVar11 - 1);
  } while( true );
  *best = dVar13;
  DVar9 = (DataKey)SPxSolverBase<double>::id(pSVar5,i);
  uVar10 = (ulong)DVar9 & 0xffffffff00000000;
  goto LAB_002018ab;
}

Assistant:

SPxId SPxSteepPR<R>::selectEnterSparseCoDim(R& best, R tol)
{
   SPxId enterId;
   const R* test          = this->thesolver->test().get_const_ptr();
   const R* weights_ptr   = this->thesolver->weights.get_const_ptr();

   int idx;
   R x;

   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = test[idx];

      if(x < -tol)
      {
         x = steeppr::computePrice(x, weights_ptr[idx], tol);

         if(x > best)
         {
            best   = x;
            enterId = this->thesolver->id(idx);
         }
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

   return enterId;
}